

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_2_6_False(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  float *data;
  ulong uVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  ulong uVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  uint uVar45;
  long lVar46;
  float *pfVar47;
  long lVar48;
  long lVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  float *pfVar54;
  int iVar55;
  long lVar56;
  int k_count;
  int iVar57;
  long lVar58;
  int iVar59;
  int iVar60;
  float *pfVar61;
  byte bVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  float fVar96;
  undefined1 auVar98 [12];
  undefined1 auVar97 [64];
  undefined1 auVar99 [12];
  undefined1 in_ZMM8 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [64];
  int data_width;
  float *local_170;
  float local_138;
  float *local_e8;
  
  auVar70._8_4_ = 0x80000000;
  auVar70._0_8_ = 0x8000000080000000;
  auVar70._12_4_ = 0x80000000;
  auVar95 = ZEXT1664(auVar70);
  auVar71._8_4_ = 0x3effffff;
  auVar71._0_8_ = 0x3effffff3effffff;
  auVar71._12_4_ = 0x3effffff;
  auVar97 = ZEXT1664(auVar71);
  fVar77 = ipoint->scale;
  auVar102 = ZEXT464((uint)fVar77);
  auVar63 = vpternlogd_avx512vl(auVar71,ZEXT416((uint)fVar77),auVar70,0xf8);
  auVar63 = ZEXT416((uint)(fVar77 + auVar63._0_4_));
  auVar63 = vroundss_avx(auVar63,auVar63,0xb);
  iVar39 = (int)auVar63._0_4_;
  fVar75 = -0.08 / (fVar77 * fVar77);
  auVar64 = vpternlogd_avx512vl(auVar71,ZEXT416((uint)ipoint->x),auVar70,0xf8);
  auVar64 = ZEXT416((uint)(ipoint->x + auVar64._0_4_));
  auVar64 = vroundss_avx(auVar64,auVar64,0xb);
  auVar65._0_8_ = (double)auVar64._0_4_;
  auVar65._8_8_ = auVar64._8_8_;
  auVar69._0_8_ = (double)fVar77;
  auVar69._8_8_ = 0;
  auVar64 = vfmadd231sd_fma(auVar65,auVar69,ZEXT816(0x3fe0000000000000));
  auVar68._0_4_ = (float)auVar64._0_8_;
  auVar68._4_12_ = auVar64._4_12_;
  auVar64 = vpternlogd_avx512vl(auVar71,ZEXT416((uint)ipoint->y),auVar70,0xf8);
  auVar64 = ZEXT416((uint)(ipoint->y + auVar64._0_4_));
  auVar64 = vroundss_avx(auVar64,auVar64,0xb);
  auVar66._0_8_ = (double)auVar64._0_4_;
  auVar66._8_8_ = auVar64._8_8_;
  auVar64 = vfmadd231sd_fma(auVar66,auVar69,ZEXT816(0x3fe0000000000000));
  auVar67._0_4_ = (float)auVar64._0_8_;
  auVar67._4_12_ = auVar64._4_12_;
  auVar64._0_4_ = (int)auVar63._0_4_;
  auVar64._4_4_ = (int)auVar63._4_4_;
  auVar64._8_4_ = (int)auVar63._8_4_;
  auVar64._12_4_ = (int)auVar63._12_4_;
  auVar63 = vcvtdq2ps_avx(auVar64);
  fVar3 = auVar68._0_4_ - auVar63._0_4_;
  fVar4 = auVar67._0_4_ - auVar63._0_4_;
  auVar63 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar77),auVar68);
  auVar64 = vpternlogd_avx512vl(auVar71,auVar63,auVar70,0xf8);
  auVar63 = ZEXT416((uint)(auVar63._0_4_ + auVar64._0_4_));
  auVar63 = vroundss_avx(auVar63,auVar63,0xb);
  auVar64 = ZEXT416((uint)fVar77);
  if (iVar39 < (int)auVar63._0_4_) {
    auVar63 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar64,auVar67);
    auVar72._8_4_ = 0x3effffff;
    auVar72._0_8_ = 0x3effffff3effffff;
    auVar72._12_4_ = 0x3effffff;
    auVar73._8_4_ = 0x80000000;
    auVar73._0_8_ = 0x8000000080000000;
    auVar73._12_4_ = 0x80000000;
    auVar65 = vpternlogd_avx512vl(auVar73,auVar63,auVar72,0xea);
    auVar63 = ZEXT416((uint)(auVar63._0_4_ + auVar65._0_4_));
    auVar63 = vroundss_avx(auVar63,auVar63,0xb);
    if (iVar39 < (int)auVar63._0_4_) {
      auVar63 = vfmadd231ss_fma(auVar68,auVar64,ZEXT416(0x41300000));
      auVar74._8_4_ = 0x80000000;
      auVar74._0_8_ = 0x8000000080000000;
      auVar74._12_4_ = 0x80000000;
      auVar65 = vpternlogd_avx512vl(auVar74,auVar63,auVar72,0xea);
      auVar63 = ZEXT416((uint)(auVar63._0_4_ + auVar65._0_4_));
      auVar63 = vroundss_avx(auVar63,auVar63,0xb);
      if ((int)auVar63._0_4_ + iVar39 <= iimage->width) {
        auVar63 = vfmadd231ss_fma(auVar67,auVar64,ZEXT416(0x41300000));
        auVar14._8_4_ = 0x80000000;
        auVar14._0_8_ = 0x8000000080000000;
        auVar14._12_4_ = 0x80000000;
        auVar65 = vpternlogd_avx512vl(auVar72,auVar63,auVar14,0xf8);
        auVar63 = ZEXT416((uint)(auVar63._0_4_ + auVar65._0_4_));
        auVar63 = vroundss_avx(auVar63,auVar63,0xb);
        if ((int)auVar63._0_4_ + iVar39 <= iimage->height) {
          fVar3 = fVar3 + 0.5;
          pfVar47 = iimage->data;
          iVar1 = iimage->data_width;
          iVar59 = iVar39 * 2;
          local_170 = haarResponseY + 0x1d;
          local_e8 = haarResponseX + 0x1d;
          uVar25 = 0xfffffff4;
          do {
            auVar63._0_4_ = (float)(int)uVar25;
            auVar99 = in_ZMM8._4_12_;
            auVar63._4_12_ = auVar99;
            auVar63 = vfmadd213ss_fma(auVar63,auVar64,ZEXT416((uint)(fVar4 + 0.5)));
            iVar18 = (int)auVar63._0_4_;
            auVar85._0_4_ = (float)(int)(uVar25 | 1);
            auVar85._4_12_ = auVar99;
            auVar63 = vfmadd213ss_fma(auVar85,auVar64,ZEXT416((uint)(fVar4 + 0.5)));
            iVar30 = (int)auVar63._0_4_;
            iVar28 = (iVar18 + -1) * iVar1;
            iVar29 = (iVar18 + -1 + iVar39) * iVar1;
            iVar31 = (iVar18 + -1 + iVar59) * iVar1;
            iVar32 = (iVar30 + -1) * iVar1;
            iVar18 = (iVar30 + -1 + iVar39) * iVar1;
            iVar30 = (iVar30 + -1 + iVar59) * iVar1;
            lVar37 = 0;
            do {
              iVar33 = (int)lVar37;
              auVar86._0_4_ = (float)(iVar33 + -0xc);
              auVar86._4_12_ = auVar99;
              auVar63 = vfmadd213ss_fma(auVar86,auVar64,ZEXT416((uint)fVar3));
              iVar24 = (int)auVar63._0_4_;
              auVar87._0_4_ = (float)(iVar33 + -0xb);
              auVar98 = auVar97._4_12_;
              auVar87._4_12_ = auVar98;
              auVar63 = vfmadd213ss_fma(auVar87,auVar64,ZEXT416((uint)fVar3));
              iVar55 = (int)auVar63._0_4_;
              auVar88._0_4_ = (float)(iVar33 + -10);
              auVar88._4_12_ = auVar98;
              auVar65 = ZEXT416((uint)fVar3);
              auVar63 = vfmadd213ss_fma(auVar88,auVar64,auVar65);
              iVar57 = (int)auVar63._0_4_;
              auVar89._0_4_ = (float)(iVar33 + -9);
              auVar89._4_12_ = auVar98;
              auVar63 = vfmadd213ss_fma(auVar89,auVar64,auVar65);
              iVar34 = (int)auVar63._0_4_;
              auVar90._0_4_ = (float)(iVar33 + -8);
              auVar90._4_12_ = auVar98;
              auVar63 = vfmadd213ss_fma(auVar90,auVar64,auVar65);
              iVar19 = (int)auVar63._0_4_;
              auVar91._0_4_ = (float)(iVar33 + -7);
              auVar91._4_12_ = auVar98;
              iVar43 = iVar24 + -1 + iVar39;
              iVar23 = iVar24 + -1 + iVar59;
              fVar77 = pfVar47[iVar29 + -1 + iVar24];
              fVar76 = pfVar47[iVar31 + -1 + iVar24];
              fVar93 = pfVar47[iVar31 + iVar23];
              fVar5 = pfVar47[iVar28 + -1 + iVar24];
              fVar6 = pfVar47[iVar28 + iVar23];
              auVar66 = SUB6416(ZEXT464(0x40000000),0);
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar28 + iVar43] -
                                                      pfVar47[iVar31 + iVar43])),auVar66,
                                        ZEXT416((uint)(fVar93 - fVar5)));
              fVar82 = pfVar47[iVar29 + iVar23];
              local_e8[lVar37 + -0x1d] = (fVar76 - fVar6) + auVar63._0_4_;
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar77 - fVar82)),auVar66,
                                        ZEXT416((uint)(fVar93 - fVar5)));
              local_170[lVar37 + -0x1d] = auVar63._0_4_ - (fVar76 - fVar6);
              iVar42 = iVar55 + -1 + iVar39;
              iVar21 = iVar55 + -1 + iVar59;
              fVar77 = pfVar47[iVar29 + -1 + iVar55];
              fVar76 = pfVar47[iVar31 + -1 + iVar55];
              fVar93 = pfVar47[iVar31 + iVar21];
              fVar5 = pfVar47[iVar28 + -1 + iVar55];
              fVar6 = pfVar47[iVar28 + iVar21];
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar28 + iVar42] -
                                                      pfVar47[iVar31 + iVar42])),auVar66,
                                        ZEXT416((uint)(fVar93 - fVar5)));
              fVar82 = pfVar47[iVar29 + iVar21];
              local_e8[lVar37 + -0x1c] = (fVar76 - fVar6) + auVar63._0_4_;
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar77 - fVar82)),auVar66,
                                        ZEXT416((uint)(fVar93 - fVar5)));
              iVar41 = iVar57 + -1 + iVar39;
              iVar60 = iVar57 + -1 + iVar59;
              local_170[lVar37 + -0x1c] = auVar63._0_4_ - (fVar76 - fVar6);
              fVar77 = pfVar47[iVar29 + -1 + iVar57];
              fVar76 = pfVar47[iVar31 + -1 + iVar57];
              fVar93 = pfVar47[iVar31 + iVar60];
              fVar5 = pfVar47[iVar28 + -1 + iVar57];
              fVar6 = pfVar47[iVar28 + iVar60];
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar28 + iVar41] -
                                                      pfVar47[iVar31 + iVar41])),auVar66,
                                        ZEXT416((uint)(fVar93 - fVar5)));
              fVar82 = pfVar47[iVar29 + iVar60];
              local_e8[lVar37 + -0x1b] = (fVar76 - fVar6) + auVar63._0_4_;
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar77 - fVar82)),auVar66,
                                        ZEXT416((uint)(fVar93 - fVar5)));
              local_170[lVar37 + -0x1b] = auVar63._0_4_ - (fVar76 - fVar6);
              iVar50 = iVar34 + -1 + iVar39;
              iVar44 = iVar34 + -1 + iVar59;
              fVar77 = pfVar47[iVar29 + -1 + iVar34];
              fVar76 = pfVar47[iVar31 + -1 + iVar34];
              fVar93 = pfVar47[iVar31 + iVar44];
              fVar5 = pfVar47[iVar28 + -1 + iVar34];
              fVar6 = pfVar47[iVar28 + iVar44];
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar28 + iVar50] -
                                                      pfVar47[iVar31 + iVar50])),auVar66,
                                        ZEXT416((uint)(fVar93 - fVar5)));
              fVar82 = pfVar47[iVar29 + iVar44];
              local_e8[lVar37 + -0x1a] = (fVar76 - fVar6) + auVar63._0_4_;
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar77 - fVar82)),auVar66,
                                        ZEXT416((uint)(fVar93 - fVar5)));
              iVar51 = iVar19 + -1 + iVar39;
              local_170[lVar37 + -0x1a] = auVar63._0_4_ - (fVar76 - fVar6);
              fVar77 = pfVar47[iVar29 + -1 + iVar19];
              fVar76 = pfVar47[iVar31 + -1 + iVar19];
              iVar53 = iVar19 + -1 + iVar59;
              fVar6 = pfVar47[iVar31 + iVar53] - pfVar47[iVar28 + -1 + iVar19];
              auVar97 = ZEXT464((uint)fVar6);
              fVar93 = pfVar47[iVar28 + iVar53];
              fVar5 = pfVar47[iVar29 + iVar53];
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar28 + iVar51] -
                                                      pfVar47[iVar31 + iVar51])),auVar66,
                                        ZEXT416((uint)fVar6));
              local_e8[lVar37 + -0x19] = (fVar76 - fVar93) + auVar63._0_4_;
              auVar63 = vfmadd213ss_fma(auVar91,auVar64,auVar65);
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar77 - fVar5)),auVar66,ZEXT416((uint)fVar6)
                                       );
              local_170[lVar37 + -0x19] = auVar65._0_4_ - (fVar76 - fVar93);
              iVar22 = (int)auVar63._0_4_;
              iVar20 = iVar22 + -1 + iVar39;
              fVar77 = pfVar47[iVar29 + -1 + iVar22];
              fVar76 = pfVar47[iVar31 + -1 + iVar22];
              iVar52 = iVar22 + -1 + iVar59;
              fVar93 = pfVar47[iVar31 + iVar52];
              fVar5 = pfVar47[iVar28 + -1 + iVar22];
              fVar6 = pfVar47[iVar28 + iVar52];
              fVar82 = pfVar47[iVar29 + iVar52];
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar28 + iVar20] -
                                                      pfVar47[iVar31 + iVar20])),auVar66,
                                        ZEXT416((uint)(fVar93 - fVar5)));
              local_e8[lVar37 + -0x18] = (fVar76 - fVar6) + auVar63._0_4_;
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar77 - fVar82)),auVar66,
                                        ZEXT416((uint)(fVar93 - fVar5)));
              local_170[lVar37 + -0x18] = auVar63._0_4_ - (fVar76 - fVar6);
              fVar77 = pfVar47[iVar18 + -1 + iVar24];
              fVar76 = pfVar47[iVar30 + -1 + iVar24];
              fVar93 = pfVar47[iVar23 + iVar30];
              fVar5 = pfVar47[iVar32 + -1 + iVar24];
              fVar6 = pfVar47[iVar32 + iVar23];
              fVar82 = pfVar47[iVar18 + iVar23];
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar32 + iVar43] -
                                                      pfVar47[iVar43 + iVar30])),auVar66,
                                        ZEXT416((uint)(fVar93 - fVar5)));
              local_e8[lVar37 + -5] = (fVar76 - fVar6) + auVar63._0_4_;
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar77 - fVar82)),auVar66,
                                        ZEXT416((uint)(fVar93 - fVar5)));
              local_170[lVar37 + -5] = auVar63._0_4_ - (fVar76 - fVar6);
              fVar77 = pfVar47[iVar18 + -1 + iVar55];
              fVar76 = pfVar47[iVar30 + -1 + iVar55];
              fVar93 = pfVar47[iVar21 + iVar30];
              fVar5 = pfVar47[iVar32 + -1 + iVar55];
              fVar6 = pfVar47[iVar32 + iVar21];
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar32 + iVar42] -
                                                      pfVar47[iVar42 + iVar30])),auVar66,
                                        ZEXT416((uint)(fVar93 - fVar5)));
              fVar82 = pfVar47[iVar18 + iVar21];
              local_e8[lVar37 + -4] = (fVar76 - fVar6) + auVar63._0_4_;
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar77 - fVar82)),auVar66,
                                        ZEXT416((uint)(fVar93 - fVar5)));
              local_170[lVar37 + -4] = auVar63._0_4_ - (fVar76 - fVar6);
              fVar77 = pfVar47[iVar18 + -1 + iVar57];
              fVar76 = pfVar47[iVar30 + -1 + iVar57];
              fVar93 = pfVar47[iVar60 + iVar30];
              fVar5 = pfVar47[iVar32 + -1 + iVar57];
              fVar6 = pfVar47[iVar32 + iVar60];
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar32 + iVar41] -
                                                      pfVar47[iVar41 + iVar30])),auVar66,
                                        ZEXT416((uint)(fVar93 - fVar5)));
              fVar82 = pfVar47[iVar18 + iVar60];
              local_e8[lVar37 + -3] = (fVar76 - fVar6) + auVar63._0_4_;
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar77 - fVar82)),auVar66,
                                        ZEXT416((uint)(fVar93 - fVar5)));
              local_170[lVar37 + -3] = auVar63._0_4_ - (fVar76 - fVar6);
              fVar77 = pfVar47[iVar18 + -1 + iVar34];
              fVar76 = pfVar47[iVar30 + -1 + iVar34];
              fVar93 = pfVar47[iVar44 + iVar30];
              fVar5 = pfVar47[iVar32 + -1 + iVar34];
              fVar6 = pfVar47[iVar32 + iVar44];
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar32 + iVar50] -
                                                      pfVar47[iVar50 + iVar30])),auVar66,
                                        ZEXT416((uint)(fVar93 - fVar5)));
              fVar82 = pfVar47[iVar18 + iVar44];
              local_e8[lVar37 + -2] = (fVar76 - fVar6) + auVar63._0_4_;
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar77 - fVar82)),auVar66,
                                        ZEXT416((uint)(fVar93 - fVar5)));
              local_170[lVar37 + -2] = auVar63._0_4_ - (fVar76 - fVar6);
              fVar77 = pfVar47[iVar18 + -1 + iVar19];
              fVar76 = pfVar47[iVar30 + -1 + iVar19];
              fVar93 = pfVar47[iVar53 + iVar30];
              fVar5 = pfVar47[iVar32 + -1 + iVar19];
              fVar6 = pfVar47[iVar32 + iVar53];
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar32 + iVar51] -
                                                      pfVar47[iVar51 + iVar30])),auVar66,
                                        ZEXT416((uint)(fVar93 - fVar5)));
              fVar82 = pfVar47[iVar18 + iVar53];
              local_e8[lVar37 + -1] = (fVar76 - fVar6) + auVar63._0_4_;
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar77 - fVar82)),auVar66,
                                        ZEXT416((uint)(fVar93 - fVar5)));
              local_170[lVar37 + -1] = auVar63._0_4_ - (fVar76 - fVar6);
              fVar77 = pfVar47[iVar18 + -1 + iVar22];
              fVar76 = pfVar47[iVar30 + -1 + iVar22];
              fVar93 = pfVar47[iVar52 + iVar30];
              fVar5 = pfVar47[iVar32 + -1 + iVar22];
              fVar6 = pfVar47[iVar32 + iVar52];
              fVar82 = pfVar47[iVar18 + iVar52];
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar32 + iVar20] -
                                                      pfVar47[iVar20 + iVar30])),auVar66,
                                        ZEXT416((uint)(fVar93 - fVar5)));
              local_e8[lVar37] = (fVar76 - fVar6) + auVar63._0_4_;
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar77 - fVar82)),auVar66,
                                        ZEXT416((uint)(fVar93 - fVar5)));
              local_170[lVar37] = auVar63._0_4_ - (fVar76 - fVar6);
              lVar37 = lVar37 + 6;
            } while (iVar33 + -0xc < 6);
            local_170 = local_170 + 0x30;
            local_e8 = local_e8 + 0x30;
            bVar2 = (int)uVar25 < 10;
            uVar25 = uVar25 + 2;
          } while (bVar2);
          goto LAB_001c442d;
        }
      }
    }
  }
  iVar1 = iVar39 * 2;
  lVar37 = 0;
  uVar25 = 0xfffffff4;
  do {
    auVar78._0_4_ = (float)(int)uVar25;
    auVar78._4_12_ = in_ZMM8._4_12_;
    auVar80._0_4_ = (float)(int)(uVar25 | 1);
    auVar80._4_12_ = in_ZMM8._4_12_;
    auVar63 = vfmadd213ss_fma(auVar78,auVar102._0_16_,ZEXT416((uint)fVar4));
    auVar65 = vfmadd213ss_fma(auVar80,auVar102._0_16_,ZEXT416((uint)fVar4));
    fVar76 = auVar63._0_4_;
    iVar57 = (int)((double)((ulong)(0.0 <= fVar76) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar76) * -0x4020000000000000) + (double)fVar76);
    fVar76 = auVar65._0_4_;
    iVar18 = (int)((double)((ulong)(0.0 <= fVar76) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar76) * -0x4020000000000000) + (double)fVar76);
    iVar28 = iVar1 + iVar57;
    iVar29 = iVar57 + -1;
    iVar30 = iVar57 + -1 + iVar39;
    iVar31 = iVar1 + iVar18;
    iVar32 = iVar18 + -1;
    iVar33 = iVar18 + -1 + iVar39;
    lVar36 = lVar37;
    iVar59 = -0xc;
    do {
      auVar79._0_4_ = (float)iVar59;
      auVar79._4_12_ = in_ZMM8._4_12_;
      auVar63 = vfmadd213ss_fma(auVar79,auVar102._0_16_,ZEXT416((uint)fVar3));
      auVar94._0_4_ = (float)(iVar59 + 1);
      auVar94._4_12_ = auVar95._4_12_;
      auVar65 = vfmadd213ss_fma(auVar94,auVar102._0_16_,ZEXT416((uint)fVar3));
      fVar93 = auVar65._0_4_;
      fVar76 = auVar63._0_4_;
      pfVar47 = (float *)((long)haarResponseY + lVar36);
      iVar34 = (int)((double)((ulong)(0.0 <= fVar76) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar76) * -0x4020000000000000) + (double)fVar76);
      if ((((iVar57 < 1) || (iVar34 < 1)) || (iimage->height < iVar28)) ||
         (iVar19 = iVar1 + iVar34, iimage->width < iVar19)) {
        haarXY(iimage,iVar57,iVar34,iVar39,(float *)((long)haarResponseX + lVar36),pfVar47);
      }
      else {
        iVar22 = iVar34 + -1 + iVar39;
        pfVar61 = iimage->data;
        iVar20 = iimage->data_width;
        iVar21 = iVar20 * iVar29;
        fVar76 = pfVar61[iVar20 * iVar30 + -1 + iVar34];
        iVar23 = iVar20 * (iVar1 + -1 + iVar57);
        fVar5 = pfVar61[iVar23 + -1 + iVar34];
        fVar6 = pfVar61[iVar23 + -1 + iVar19];
        fVar82 = pfVar61[iVar21 + -1 + iVar34];
        fVar7 = pfVar61[iVar21 + -1 + iVar19];
        fVar8 = pfVar61[iVar20 * iVar30 + -1 + iVar19];
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar61[iVar21 + iVar22] - pfVar61[iVar23 + iVar22]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar82)));
        *(float *)((long)haarResponseX + lVar36) = (fVar5 - fVar7) + auVar63._0_4_;
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar76 - fVar8)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar82)));
        *pfVar47 = auVar63._0_4_ - (fVar5 - fVar7);
      }
      iVar19 = (int)((double)((ulong)(0.0 <= fVar93) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar93) * -0x4020000000000000) + (double)fVar93);
      pfVar47 = (float *)((long)haarResponseX + lVar36 + 4);
      pfVar61 = (float *)((long)haarResponseY + lVar36 + 4);
      if (((iVar57 < 1) || (iVar19 < 1)) ||
         ((iimage->height < iVar28 || (iVar20 = iVar1 + iVar19, iimage->width < iVar20)))) {
        haarXY(iimage,iVar57,iVar19,iVar39,pfVar47,pfVar61);
      }
      else {
        iVar23 = iVar19 + -1 + iVar39;
        pfVar54 = iimage->data;
        iVar21 = iimage->data_width;
        iVar22 = iVar21 * iVar29;
        fVar76 = pfVar54[iVar21 * iVar30 + -1 + iVar19];
        iVar24 = iVar21 * (iVar1 + -1 + iVar57);
        fVar93 = pfVar54[iVar24 + -1 + iVar19];
        fVar5 = pfVar54[iVar24 + -1 + iVar20];
        fVar6 = pfVar54[iVar22 + -1 + iVar19];
        fVar82 = pfVar54[iVar22 + -1 + iVar20];
        fVar7 = pfVar54[iVar21 * iVar30 + -1 + iVar20];
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar22 + iVar23] - pfVar54[iVar24 + iVar23]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar47 = (fVar93 - fVar82) + auVar63._0_4_;
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar76 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar61 = auVar63._0_4_ - (fVar93 - fVar82);
      }
      auVar63 = vpbroadcastd_avx512vl();
      auVar63 = vpaddd_avx(auVar63,_DAT_005766e0);
      auVar63 = vcvtdq2ps_avx(auVar63);
      auVar17._4_4_ = fVar3;
      auVar17._0_4_ = fVar3;
      auVar17._8_4_ = fVar3;
      auVar17._12_4_ = fVar3;
      auVar16._4_4_ = fVar77;
      auVar16._0_4_ = fVar77;
      auVar16._8_4_ = fVar77;
      auVar16._12_4_ = fVar77;
      auVar65 = vfmadd132ps_fma(auVar63,auVar17,auVar16);
      auVar63 = vshufps_avx(auVar65,auVar65,0xff);
      uVar26 = vcmpps_avx512vl(auVar65,_DAT_00576190,0xd);
      bVar62 = (byte)(uVar26 >> 3);
      iVar20 = (int)((double)((ulong)(bVar62 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar62 & 1) * -0x4020000000000000) +
                    (double)auVar63._0_4_);
      pfVar47 = (float *)((long)haarResponseX + lVar36 + 8);
      pfVar61 = (float *)((long)haarResponseY + lVar36 + 8);
      if (((iVar57 < 1) || (iVar20 < 1)) ||
         ((iimage->height < iVar28 || (iVar21 = iVar1 + iVar20, iimage->width < iVar21)))) {
        haarXY(iimage,iVar57,iVar20,iVar39,pfVar47,pfVar61);
      }
      else {
        iVar24 = iVar20 + -1 + iVar39;
        pfVar54 = iimage->data;
        iVar22 = iimage->data_width;
        iVar23 = iVar22 * iVar29;
        fVar76 = pfVar54[iVar22 * iVar30 + -1 + iVar20];
        iVar44 = iVar22 * (iVar1 + -1 + iVar57);
        fVar93 = pfVar54[iVar44 + -1 + iVar20];
        fVar5 = pfVar54[iVar44 + -1 + iVar21];
        fVar6 = pfVar54[iVar23 + -1 + iVar20];
        fVar82 = pfVar54[iVar23 + -1 + iVar21];
        fVar7 = pfVar54[iVar22 * iVar30 + -1 + iVar21];
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar23 + iVar24] - pfVar54[iVar44 + iVar24]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar47 = (fVar93 - fVar82) + auVar63._0_4_;
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar76 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar61 = auVar63._0_4_ - (fVar93 - fVar82);
      }
      bVar62 = (byte)uVar26;
      auVar63 = vpermilpd_avx(auVar65,1);
      iVar21 = (int)((double)((ulong)(bVar62 >> 2 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar62 >> 2 & 1) * -0x4020000000000000) +
                    (double)auVar63._0_4_);
      pfVar47 = (float *)((long)haarResponseX + lVar36 + 0xc);
      pfVar61 = (float *)((long)haarResponseY + lVar36 + 0xc);
      if ((((iVar57 < 1) || (iVar21 < 1)) || (iimage->height < iVar28)) ||
         (iVar22 = iVar1 + iVar21, iimage->width < iVar22)) {
        haarXY(iimage,iVar57,iVar21,iVar39,pfVar47,pfVar61);
      }
      else {
        iVar44 = iVar21 + -1 + iVar39;
        pfVar54 = iimage->data;
        iVar23 = iimage->data_width;
        iVar24 = iVar23 * iVar29;
        fVar76 = pfVar54[iVar23 * iVar30 + -1 + iVar21];
        iVar43 = iVar23 * (iVar1 + -1 + iVar57);
        fVar93 = pfVar54[iVar43 + -1 + iVar21];
        fVar5 = pfVar54[iVar43 + -1 + iVar22];
        fVar6 = pfVar54[iVar24 + -1 + iVar21];
        fVar82 = pfVar54[iVar24 + -1 + iVar22];
        fVar7 = pfVar54[iVar23 * iVar30 + -1 + iVar22];
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar24 + iVar44] - pfVar54[iVar43 + iVar44]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar47 = (fVar93 - fVar82) + auVar63._0_4_;
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar76 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar61 = auVar63._0_4_ - (fVar93 - fVar82);
      }
      auVar63 = vmovshdup_avx(auVar65);
      iVar22 = (int)((double)((ulong)(bVar62 >> 1 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar62 >> 1 & 1) * -0x4020000000000000) +
                    (double)auVar63._0_4_);
      pfVar47 = (float *)((long)haarResponseX + lVar36 + 0x10);
      pfVar61 = (float *)((long)haarResponseY + lVar36 + 0x10);
      if (((iVar57 < 1) || (iVar22 < 1)) ||
         ((iimage->height < iVar28 || (iVar23 = iVar1 + iVar22, iimage->width < iVar23)))) {
        haarXY(iimage,iVar57,iVar22,iVar39,pfVar47,pfVar61);
      }
      else {
        iVar43 = iVar22 + -1 + iVar39;
        pfVar54 = iimage->data;
        iVar24 = iimage->data_width;
        iVar44 = iVar24 * iVar29;
        fVar76 = pfVar54[iVar24 * iVar30 + -1 + iVar22];
        iVar42 = iVar24 * (iVar1 + -1 + iVar57);
        fVar93 = pfVar54[iVar42 + -1 + iVar22];
        fVar5 = pfVar54[iVar42 + -1 + iVar23];
        fVar6 = pfVar54[iVar44 + -1 + iVar22];
        fVar82 = pfVar54[iVar44 + -1 + iVar23];
        fVar7 = pfVar54[iVar24 * iVar30 + -1 + iVar23];
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar44 + iVar43] - pfVar54[iVar42 + iVar43]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar47 = (fVar93 - fVar82) + auVar63._0_4_;
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar76 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar61 = auVar63._0_4_ - (fVar93 - fVar82);
      }
      local_138 = auVar65._0_4_;
      iVar23 = (int)((double)((ulong)(bVar62 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar62 & 1) * -0x4020000000000000) + (double)local_138);
      pfVar47 = (float *)((long)haarResponseX + lVar36 + 0x14);
      pfVar61 = (float *)((long)haarResponseY + lVar36 + 0x14);
      if (((iVar57 < 1) || (iVar23 < 1)) ||
         ((iimage->height < iVar28 || (iVar24 = iVar1 + iVar23, iimage->width < iVar24)))) {
        haarXY(iimage,iVar57,iVar23,iVar39,pfVar47,pfVar61);
      }
      else {
        iVar42 = iVar23 + -1 + iVar39;
        pfVar54 = iimage->data;
        iVar44 = iimage->data_width;
        iVar43 = iVar44 * iVar29;
        fVar76 = pfVar54[iVar44 * iVar30 + -1 + iVar23];
        iVar41 = iVar44 * (iVar1 + -1 + iVar57);
        fVar93 = pfVar54[iVar41 + -1 + iVar23];
        fVar5 = pfVar54[iVar41 + -1 + iVar24];
        fVar6 = pfVar54[iVar43 + -1 + iVar23];
        fVar82 = pfVar54[iVar43 + -1 + iVar24];
        fVar7 = pfVar54[iVar44 * iVar30 + -1 + iVar24];
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar43 + iVar42] - pfVar54[iVar41 + iVar42]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar47 = (fVar93 - fVar82) + auVar63._0_4_;
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar76 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar61 = auVar63._0_4_ - (fVar93 - fVar82);
      }
      pfVar47 = (float *)((long)haarResponseX + lVar36 + 0x60);
      pfVar61 = (float *)((long)haarResponseY + lVar36 + 0x60);
      if ((((iVar18 < 1) || (iVar34 < 1)) || (iimage->height < iVar31)) ||
         (iVar24 = iVar1 + iVar34, iimage->width < iVar24)) {
        haarXY(iimage,iVar18,iVar34,iVar39,pfVar47,pfVar61);
      }
      else {
        iVar43 = iVar34 + -1 + iVar39;
        pfVar54 = iimage->data;
        iVar44 = iimage->data_width;
        iVar41 = iVar44 * iVar32;
        fVar76 = pfVar54[iVar44 * iVar33 + -1 + iVar34];
        iVar42 = iVar44 * (iVar1 + -1 + iVar18);
        fVar93 = pfVar54[iVar42 + -1 + iVar34];
        fVar5 = pfVar54[iVar42 + -1 + iVar24];
        fVar6 = pfVar54[iVar41 + -1 + iVar34];
        fVar82 = pfVar54[iVar41 + -1 + iVar24];
        fVar7 = pfVar54[iVar44 * iVar33 + -1 + iVar24];
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar41 + iVar43] - pfVar54[iVar42 + iVar43]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar47 = (fVar93 - fVar82) + auVar63._0_4_;
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar76 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar61 = auVar63._0_4_ - (fVar93 - fVar82);
      }
      pfVar47 = (float *)((long)haarResponseX + lVar36 + 100);
      pfVar61 = (float *)((long)haarResponseY + lVar36 + 100);
      if (((iVar18 < 1) || (iVar19 < 1)) ||
         ((iimage->height < iVar31 || (iVar34 = iVar1 + iVar19, iimage->width < iVar34)))) {
        haarXY(iimage,iVar18,iVar19,iVar39,pfVar47,pfVar61);
      }
      else {
        iVar44 = iVar19 + -1 + iVar39;
        pfVar54 = iimage->data;
        iVar24 = iimage->data_width;
        iVar42 = iVar24 * iVar32;
        fVar76 = pfVar54[iVar24 * iVar33 + -1 + iVar19];
        iVar43 = iVar24 * (iVar1 + -1 + iVar18);
        fVar93 = pfVar54[iVar43 + -1 + iVar19];
        fVar5 = pfVar54[iVar43 + -1 + iVar34];
        fVar6 = pfVar54[iVar42 + -1 + iVar19];
        fVar82 = pfVar54[iVar42 + -1 + iVar34];
        fVar7 = pfVar54[iVar24 * iVar33 + -1 + iVar34];
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar42 + iVar44] - pfVar54[iVar43 + iVar44]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar47 = (fVar93 - fVar82) + auVar63._0_4_;
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar76 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar61 = auVar63._0_4_ - (fVar93 - fVar82);
      }
      pfVar47 = (float *)((long)haarResponseX + lVar36 + 0x68);
      pfVar61 = (float *)((long)haarResponseY + lVar36 + 0x68);
      if (((iVar18 < 1) || (iVar20 < 1)) ||
         ((iimage->height < iVar31 || (iVar34 = iVar1 + iVar20, iimage->width < iVar34)))) {
        haarXY(iimage,iVar18,iVar20,iVar39,pfVar47,pfVar61);
      }
      else {
        iVar24 = iVar20 + -1 + iVar39;
        pfVar54 = iimage->data;
        iVar19 = iimage->data_width;
        iVar43 = iVar19 * iVar32;
        fVar76 = pfVar54[iVar19 * iVar33 + -1 + iVar20];
        iVar44 = iVar19 * (iVar1 + -1 + iVar18);
        fVar93 = pfVar54[iVar44 + -1 + iVar20];
        fVar5 = pfVar54[iVar44 + -1 + iVar34];
        fVar6 = pfVar54[iVar43 + -1 + iVar20];
        fVar82 = pfVar54[iVar43 + -1 + iVar34];
        fVar7 = pfVar54[iVar19 * iVar33 + -1 + iVar34];
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar43 + iVar24] - pfVar54[iVar44 + iVar24]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar47 = (fVar93 - fVar82) + auVar63._0_4_;
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar76 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar61 = auVar63._0_4_ - (fVar93 - fVar82);
      }
      pfVar47 = (float *)((long)haarResponseX + lVar36 + 0x6c);
      pfVar61 = (float *)((long)haarResponseY + lVar36 + 0x6c);
      if ((((iVar18 < 1) || (iVar21 < 1)) || (iimage->height < iVar31)) ||
         (iVar34 = iVar1 + iVar21, iimage->width < iVar34)) {
        haarXY(iimage,iVar18,iVar21,iVar39,pfVar47,pfVar61);
      }
      else {
        iVar20 = iVar21 + -1 + iVar39;
        pfVar54 = iimage->data;
        iVar19 = iimage->data_width;
        iVar44 = iVar19 * iVar32;
        fVar76 = pfVar54[iVar19 * iVar33 + -1 + iVar21];
        iVar24 = iVar19 * (iVar1 + -1 + iVar18);
        fVar93 = pfVar54[iVar24 + -1 + iVar21];
        fVar5 = pfVar54[iVar24 + -1 + iVar34];
        fVar6 = pfVar54[iVar44 + -1 + iVar21];
        fVar82 = pfVar54[iVar44 + -1 + iVar34];
        fVar7 = pfVar54[iVar19 * iVar33 + -1 + iVar34];
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar44 + iVar20] - pfVar54[iVar24 + iVar20]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar47 = (fVar93 - fVar82) + auVar63._0_4_;
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar76 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar61 = auVar63._0_4_ - (fVar93 - fVar82);
      }
      pfVar47 = (float *)((long)haarResponseX + lVar36 + 0x70);
      pfVar61 = (float *)((long)haarResponseY + lVar36 + 0x70);
      if (((iVar18 < 1) || (iVar22 < 1)) ||
         ((iimage->height < iVar31 || (iVar34 = iVar1 + iVar22, iimage->width < iVar34)))) {
        haarXY(iimage,iVar18,iVar22,iVar39,pfVar47,pfVar61);
      }
      else {
        iVar20 = iVar22 + -1 + iVar39;
        pfVar54 = iimage->data;
        iVar19 = iimage->data_width;
        iVar24 = iVar19 * iVar32;
        fVar76 = pfVar54[iVar19 * iVar33 + -1 + iVar22];
        iVar21 = iVar19 * (iVar1 + -1 + iVar18);
        fVar93 = pfVar54[iVar21 + -1 + iVar22];
        fVar5 = pfVar54[iVar21 + -1 + iVar34];
        fVar6 = pfVar54[iVar24 + -1 + iVar22];
        fVar82 = pfVar54[iVar24 + -1 + iVar34];
        fVar7 = pfVar54[iVar19 * iVar33 + -1 + iVar34];
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar24 + iVar20] - pfVar54[iVar21 + iVar20]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar47 = (fVar93 - fVar82) + auVar63._0_4_;
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar76 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar61 = auVar63._0_4_ - (fVar93 - fVar82);
      }
      pfVar47 = (float *)((long)haarResponseX + lVar36 + 0x74);
      pfVar61 = (float *)((long)haarResponseY + lVar36 + 0x74);
      if (((iVar18 < 1) || (iVar23 < 1)) ||
         ((iimage->height < iVar31 || (iVar34 = iVar1 + iVar23, iimage->width < iVar34)))) {
        haarXY(iimage,iVar18,iVar23,iVar39,pfVar47,pfVar61);
      }
      else {
        iVar20 = iVar23 + -1 + iVar39;
        pfVar54 = iimage->data;
        iVar19 = iimage->data_width;
        iVar22 = iVar19 * iVar32;
        fVar76 = pfVar54[iVar19 * iVar33 + -1 + iVar23];
        iVar21 = iVar19 * (iVar1 + -1 + iVar18);
        fVar93 = pfVar54[iVar21 + -1 + iVar23];
        fVar5 = pfVar54[iVar21 + -1 + iVar34];
        fVar6 = pfVar54[iVar22 + -1 + iVar23];
        fVar82 = pfVar54[iVar22 + -1 + iVar34];
        fVar7 = pfVar54[iVar19 * iVar33 + -1 + iVar34];
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar22 + iVar20] - pfVar54[iVar21 + iVar20]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar47 = (fVar93 - fVar82) + auVar63._0_4_;
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar76 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar61 = auVar63._0_4_ - (fVar93 - fVar82);
      }
      auVar102 = ZEXT1664(auVar64);
      lVar36 = lVar36 + 0x18;
      bVar2 = iVar59 < 6;
      iVar59 = iVar59 + 6;
    } while (bVar2);
    lVar37 = lVar37 + 0xc0;
    bVar2 = (int)uVar25 < 10;
    uVar25 = uVar25 + 2;
  } while (bVar2);
LAB_001c442d:
  fVar77 = auVar102._0_4_;
  auVar101._8_4_ = 0x3effffff;
  auVar101._0_8_ = 0x3effffff3effffff;
  auVar101._12_4_ = 0x3effffff;
  auVar100._8_4_ = 0x80000000;
  auVar100._0_8_ = 0x8000000080000000;
  auVar100._12_4_ = 0x80000000;
  auVar63 = vpternlogd_avx512vl(auVar101,ZEXT416((uint)(fVar77 * 0.5)),auVar100,0xf8);
  auVar63 = ZEXT416((uint)(fVar77 * 0.5 + auVar63._0_4_));
  auVar63 = vroundss_avx(auVar63,auVar63,0xb);
  auVar64 = vpternlogd_avx512vl(auVar101,ZEXT416((uint)(fVar77 * 1.5)),auVar100,0xf8);
  auVar64 = ZEXT416((uint)(fVar77 * 1.5 + auVar64._0_4_));
  auVar64 = vroundss_avx(auVar64,auVar64,0xb);
  auVar65 = vpternlogd_avx512vl(auVar101,ZEXT416((uint)(fVar77 * 2.5)),auVar100,0xf8);
  auVar65 = ZEXT416((uint)(fVar77 * 2.5 + auVar65._0_4_));
  auVar65 = vroundss_avx(auVar65,auVar65,0xb);
  auVar66 = vpternlogd_avx512vl(auVar101,ZEXT416((uint)(fVar77 * 3.5)),auVar100,0xf8);
  auVar66 = ZEXT416((uint)(fVar77 * 3.5 + auVar66._0_4_));
  auVar66 = vroundss_avx(auVar66,auVar66,0xb);
  auVar67 = vpternlogd_avx512vl(auVar101,ZEXT416((uint)(fVar77 * 4.5)),auVar100,0xf8);
  auVar67 = ZEXT416((uint)(fVar77 * 4.5 + auVar67._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  auVar68 = vpternlogd_avx512vl(auVar101,ZEXT416((uint)(fVar77 * 5.5)),auVar100,0xf8);
  auVar68 = ZEXT416((uint)(fVar77 * 5.5 + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar69 = vpternlogd_avx512vl(auVar101,ZEXT416((uint)(fVar77 * 6.5)),auVar100,0xf8);
  auVar69 = ZEXT416((uint)(fVar77 * 6.5 + auVar69._0_4_));
  auVar69 = vroundss_avx(auVar69,auVar69,0xb);
  auVar70 = vpternlogd_avx512vl(auVar101,ZEXT416((uint)(fVar77 * 7.5)),auVar100,0xf8);
  auVar70 = ZEXT416((uint)(auVar70._0_4_ + fVar77 * 7.5));
  auVar70 = vroundss_avx(auVar70,auVar70,0xb);
  auVar71 = vpternlogd_avx512vl(auVar101,ZEXT416((uint)(fVar77 * 8.5)),auVar100,0xf8);
  auVar71 = ZEXT416((uint)(fVar77 * 8.5 + auVar71._0_4_));
  auVar71 = vroundss_avx(auVar71,auVar71,0xb);
  auVar72 = vpternlogd_avx512vl(auVar101,ZEXT416((uint)(fVar77 * 9.5)),auVar100,0xf8);
  auVar72 = ZEXT416((uint)(fVar77 * 9.5 + auVar72._0_4_));
  auVar72 = vroundss_avx(auVar72,auVar72,0xb);
  auVar73 = vpternlogd_avx512vl(auVar101,ZEXT416((uint)(fVar77 * 10.5)),auVar100,0xf8);
  auVar73 = ZEXT416((uint)(fVar77 * 10.5 + auVar73._0_4_));
  auVar73 = vroundss_avx(auVar73,auVar73,0xb);
  auVar74 = vpternlogd_avx512vl(auVar101,ZEXT416((uint)(fVar77 * 11.5)),auVar100,0xf8);
  auVar74 = ZEXT416((uint)(fVar77 * 11.5 + auVar74._0_4_));
  auVar74 = vroundss_avx(auVar74,auVar74,0xb);
  fVar82 = auVar65._0_4_;
  fVar77 = fVar82 + auVar64._0_4_;
  fVar3 = fVar82 + auVar63._0_4_;
  fVar4 = fVar82 - auVar63._0_4_;
  fVar76 = fVar82 - auVar64._0_4_;
  fVar93 = fVar82 - auVar66._0_4_;
  fVar5 = fVar82 - auVar67._0_4_;
  fVar6 = fVar82 - auVar68._0_4_;
  fVar82 = fVar82 - auVar69._0_4_;
  fVar96 = auVar70._0_4_;
  fVar7 = fVar96 - auVar66._0_4_;
  fVar8 = fVar96 - auVar67._0_4_;
  fVar9 = fVar96 - auVar68._0_4_;
  fVar10 = fVar96 - auVar69._0_4_;
  fVar11 = fVar96 - auVar71._0_4_;
  fVar12 = fVar96 - auVar72._0_4_;
  fVar13 = fVar96 - auVar73._0_4_;
  fVar96 = fVar96 - auVar74._0_4_;
  gauss_s1_c0[0] = expf(fVar77 * fVar77 * fVar75);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar75);
  gauss_s1_c0[2] = expf(fVar4 * fVar4 * fVar75);
  gauss_s1_c0[3] = expf(fVar76 * fVar76 * fVar75);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar93 * fVar93 * fVar75);
  gauss_s1_c0[6] = expf(fVar5 * fVar5 * fVar75);
  gauss_s1_c0[7] = expf(fVar6 * fVar6 * fVar75);
  gauss_s1_c0[8] = expf(fVar82 * fVar82 * fVar75);
  gauss_s1_c1[0] = expf(fVar7 * fVar7 * fVar75);
  gauss_s1_c1[1] = expf(fVar8 * fVar8 * fVar75);
  gauss_s1_c1[2] = expf(fVar9 * fVar9 * fVar75);
  gauss_s1_c1[3] = expf(fVar10 * fVar10 * fVar75);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar11 * fVar11 * fVar75);
  gauss_s1_c1[6] = expf(fVar12 * fVar12 * fVar75);
  gauss_s1_c1[7] = expf(fVar13 * fVar13 * fVar75);
  gauss_s1_c1[8] = expf(fVar96 * fVar96 * fVar75);
  uVar26 = 0xfffffff8;
  lVar37 = 0;
  fVar77 = 0.0;
  auVar81._8_4_ = 0x7fffffff;
  auVar81._0_8_ = 0x7fffffff7fffffff;
  auVar81._12_4_ = 0x7fffffff;
  lVar36 = 0;
  lVar48 = 0;
  do {
    pfVar47 = gauss_s1_c1;
    uVar25 = (uint)uVar26;
    if (uVar25 != 7) {
      pfVar47 = gauss_s1_c0;
    }
    if (uVar25 == 0xfffffff8) {
      pfVar47 = gauss_s1_c1;
    }
    lVar36 = (long)(int)lVar36;
    iVar39 = (int)lVar48;
    lVar48 = (long)iVar39;
    lVar46 = (long)haarResponseX + lVar37;
    lVar38 = (long)haarResponseY + lVar37;
    uVar45 = 0xfffffff8;
    uVar40 = 0;
    do {
      pfVar61 = gauss_s1_c1;
      if (uVar45 != 7) {
        pfVar61 = gauss_s1_c0;
      }
      if (uVar45 == 0xfffffff8) {
        pfVar61 = gauss_s1_c1;
      }
      uVar27 = (ulong)(uVar45 >> 0x1c & 0xfffffff8);
      auVar95 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar35 = uVar40;
      lVar56 = lVar46;
      lVar58 = lVar38;
      do {
        lVar49 = 0;
        pfVar54 = (float *)((long)pfVar47 + (ulong)(uint)((int)(uVar26 >> 0x1f) << 5));
        do {
          fVar3 = pfVar61[uVar27] * *pfVar54;
          auVar63 = vinsertps_avx(ZEXT416(*(uint *)(lVar58 + lVar49 * 4)),
                                  ZEXT416(*(uint *)(lVar56 + lVar49 * 4)),0x10);
          auVar92._0_4_ = fVar3 * auVar63._0_4_;
          auVar92._4_4_ = fVar3 * auVar63._4_4_;
          auVar92._8_4_ = fVar3 * auVar63._8_4_;
          auVar92._12_4_ = fVar3 * auVar63._12_4_;
          auVar63 = vandps_avx(auVar92,auVar81);
          auVar63 = vmovlhps_avx(auVar92,auVar63);
          auVar83._0_4_ = auVar95._0_4_ + auVar63._0_4_;
          auVar83._4_4_ = auVar95._4_4_ + auVar63._4_4_;
          auVar83._8_4_ = auVar95._8_4_ + auVar63._8_4_;
          auVar83._12_4_ = auVar95._12_4_ + auVar63._12_4_;
          auVar95 = ZEXT1664(auVar83);
          pfVar54 = pfVar54 + (ulong)(~uVar25 >> 0x1f) * 2 + -1;
          lVar49 = lVar49 + 1;
        } while (lVar49 != 9);
        uVar35 = uVar35 + 0x18;
        uVar27 = uVar27 + (ulong)(-1 < (int)uVar45) * 2 + -1;
        lVar56 = lVar56 + 0x60;
        lVar58 = lVar58 + 0x60;
      } while (uVar35 < uVar45 * 0x18 + 0x198);
      fVar3 = gauss_s2_arr[lVar48];
      auVar15._4_4_ = fVar3;
      auVar15._0_4_ = fVar3;
      auVar15._8_4_ = fVar3;
      auVar15._12_4_ = fVar3;
      auVar65 = vmulps_avx512vl(auVar83,auVar15);
      lVar48 = lVar48 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar36) = auVar65;
      auVar84._0_4_ = auVar65._0_4_ * auVar65._0_4_;
      auVar84._4_4_ = auVar65._4_4_ * auVar65._4_4_;
      auVar84._8_4_ = auVar65._8_4_ * auVar65._8_4_;
      auVar84._12_4_ = auVar65._12_4_ * auVar65._12_4_;
      auVar63 = vmovshdup_avx(auVar84);
      auVar64 = vfmadd231ss_fma(auVar63,auVar65,auVar65);
      auVar63 = vshufpd_avx(auVar65,auVar65,1);
      auVar64 = vfmadd213ss_fma(auVar63,auVar63,auVar64);
      auVar63 = vshufps_avx(auVar65,auVar65,0xff);
      auVar63 = vfmadd213ss_fma(auVar63,auVar63,auVar64);
      fVar77 = fVar77 + auVar63._0_4_;
      lVar36 = lVar36 + 4;
      uVar45 = uVar45 + 5;
      uVar40 = uVar40 + 0x78;
      lVar46 = lVar46 + 0x1e0;
      lVar38 = lVar38 + 0x1e0;
    } while (iVar39 + 4 != (int)lVar48);
    lVar37 = lVar37 + 0x14;
    uVar26 = (ulong)(uVar25 + 5);
  } while ((int)uVar25 < 3);
  if (fVar77 < 0.0) {
    fVar77 = sqrtf(fVar77);
  }
  else {
    auVar63 = vsqrtss_avx(ZEXT416((uint)fVar77),ZEXT416((uint)fVar77));
    fVar77 = auVar63._0_4_;
  }
  auVar95 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar77)));
  lVar37 = 0;
  do {
    auVar97 = vmulps_avx512f(auVar95,*(undefined1 (*) [64])(ipoint->descriptor + lVar37));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar37) = auVar97;
    lVar37 = lVar37 + 0x10;
  } while (lVar37 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_6_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}